

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::OptionParser::validateArgs(OptionParser *this,Command *args)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  string local_260;
  allocator<char> local_239;
  string local_238;
  pluralise local_218;
  allocator<char> local_1e9;
  string local_1e8;
  pluralise local_1c8;
  ostringstream local_190 [8];
  ostringstream oss;
  Command *args_local;
  OptionParser *this_local;
  
  bVar2 = tooFewArgs(this,args);
  if ((!bVar2) && (bVar2 = tooManyArgs(this,args), !bVar2)) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  if (this->m_maxArgs == -1) {
    poVar3 = std::operator<<((ostream *)local_190,"Expected at least ");
    iVar1 = this->m_minArgs;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"argument",&local_1e9);
    pluralise::pluralise(&local_1c8,(long)iVar1,&local_1e8);
    Catch::operator<<(poVar3,&local_1c8);
    pluralise::~pluralise(&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
  }
  else if (this->m_minArgs == this->m_maxArgs) {
    poVar3 = std::operator<<((ostream *)local_190,"Expected ");
    iVar1 = this->m_minArgs;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"argument",&local_239);
    pluralise::pluralise(&local_218,(long)iVar1,&local_238);
    Catch::operator<<(poVar3,&local_218);
    pluralise::~pluralise(&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_239);
  }
  else {
    poVar3 = std::operator<<((ostream *)local_190,"Expected between ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->m_minArgs);
    poVar3 = std::operator<<(poVar3," and ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->m_maxArgs);
    std::operator<<(poVar3," argument");
  }
  std::__cxx11::ostringstream::str();
  Command::raiseError(args,&local_260);
}

Assistant:

void validateArgs( const Command& args ) const {
            if(  tooFewArgs( args ) || tooManyArgs( args ) ) {
                std::ostringstream oss;
                if( m_maxArgs == -1 )
                    oss <<"Expected at least " << pluralise( static_cast<std::size_t>( m_minArgs ), "argument" );
                else if( m_minArgs == m_maxArgs )
                    oss <<"Expected " << pluralise( static_cast<std::size_t>( m_minArgs ), "argument" );
                else
                    oss <<"Expected between " << m_minArgs << " and " << m_maxArgs << " argument";
                args.raiseError( oss.str() );
            }
        }